

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_write_scores(acmod_t *acmod,int n_active,uint8 *active,int16 *senscr,FILE *senfh)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int16 n_active2;
  undefined1 local_32 [2];
  
  sVar1 = fwrite(local_32,2,1,(FILE *)senfh);
  if (sVar1 == 1) {
    sVar1 = (size_t)n_active;
    if (acmod->mdef->n_sen == n_active) {
      sVar2 = fwrite(senscr,2,sVar1,(FILE *)senfh);
      if (sVar2 == sVar1) {
        return 0;
      }
    }
    else {
      sVar2 = fwrite(active,1,sVar1,(FILE *)senfh);
      if (sVar2 == sVar1) {
        if (n_active < 1) {
          return 0;
        }
        uVar4 = 0;
        uVar3 = 0;
        while( true ) {
          uVar3 = (ulong)((uint)active[uVar4] + (int)uVar3);
          sVar1 = fwrite(senscr + uVar3,2,1,(FILE *)senfh);
          if (sVar1 != 1) break;
          uVar4 = uVar4 + 1;
          if ((uint)n_active == uVar4) {
            return 0;
          }
        }
      }
    }
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                 ,0x393,"Failed to write frame to senone file");
  return -1;
}

Assistant:

int
acmod_write_scores(acmod_t *acmod, int n_active, uint8 const *active,
                   int16 const *senscr, FILE *senfh)
{
    int16 n_active2;

    /* Uncompressed frame format:
     *
     * (2 bytes) n_active: Number of active senones
     * If all senones active:
     * (n_active * 2 bytes) scores of active senones
     *
     * Otherwise:
     * (2 bytes) n_active: Number of active senones
     * (n_active bytes) deltas to active senones
     * (n_active * 2 bytes) scores of active senones
     */
    n_active2 = n_active;
    if (fwrite(&n_active2, 2, 1, senfh) != 1)
        goto error_out;
    if (n_active == bin_mdef_n_sen(acmod->mdef)) {
        if (fwrite(senscr, 2, n_active, senfh) != (size_t) n_active)
            goto error_out;
    }
    else {
        int i, n;
        if (fwrite(active, 1, n_active, senfh) != (size_t) n_active)
            goto error_out;
        for (i = n = 0; i < n_active; ++i) {
            n += active[i];
            if (fwrite(senscr + n, 2, 1, senfh) != 1)
                goto error_out;
        }
    }
    return 0;
error_out:
    E_ERROR_SYSTEM("Failed to write frame to senone file");
    return -1;
}